

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgpsec_utils.c
# Opt level: O0

int load_public_key(EC_KEY **pub_key,uint8_t *spki)

{
  int iVar1;
  EC_KEY *pEVar2;
  long in_FS_OFFSET;
  int status;
  uint8_t *spki_local;
  EC_KEY **pub_key_local;
  uint8_t *local_18;
  char *p;
  
  p = *(char **)(in_FS_OFFSET + 0x28);
  *pub_key = (EC_KEY *)0x0;
  local_18 = spki;
  pEVar2 = d2i_EC_PUBKEY((EC_KEY **)0x0,&local_18,0x5b);
  *pub_key = (EC_KEY *)pEVar2;
  if (*pub_key == (EC_KEY *)0x0) {
    pub_key_local._4_4_ = -2;
  }
  else {
    iVar1 = EC_KEY_check_key((EC_KEY *)*pub_key);
    if (iVar1 == 0) {
      EC_KEY_free((EC_KEY *)*pub_key);
      *pub_key = (EC_KEY *)0x0;
      pub_key_local._4_4_ = -2;
    }
    else {
      pub_key_local._4_4_ = 0;
    }
  }
  if (*(char **)(in_FS_OFFSET + 0x28) == p) {
    return pub_key_local._4_4_;
  }
  __stack_chk_fail();
}

Assistant:

int load_public_key(EC_KEY **pub_key, uint8_t *spki)
{
	char *p = NULL;
	int status = 0;

	p = (char *)spki;
	*pub_key = NULL;

	/* This whole procedure is one way to copy the spki into
	 * an EC_KEY, suggested by OpenSSL. Basically, this function
	 * returns the public key as a long int, which can later be
	 * casted to an EC_KEY
	 */
	*pub_key = d2i_EC_PUBKEY(NULL, (const unsigned char **)&p, (long)SPKI_SIZE);

	if (!*pub_key)
		return RTR_BGPSEC_LOAD_PUB_KEY_ERROR;

	status = EC_KEY_check_key(*pub_key);
	if (status == 0) {
		EC_KEY_free(*pub_key);
		*pub_key = NULL;
		return RTR_BGPSEC_LOAD_PUB_KEY_ERROR;
	}

	return RTR_BGPSEC_SUCCESS;
}